

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O2

void __thiscall
duckdb::TableColumnHelper::TableColumnHelper(TableColumnHelper *this,TableCatalogEntry *entry)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar3;
  pointer pCVar4;
  NotNullConstraint *pNVar5;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *constraint;
  pointer this_00;
  
  (this->super_ColumnHelper)._vptr_ColumnHelper = (_func_int **)&PTR__TableColumnHelper_027952b0;
  this->entry = entry;
  p_Var1 = &(this->not_null_cols)._M_t._M_impl.super__Rb_tree_header;
  (this->not_null_cols)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->not_null_cols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->not_null_cols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->not_null_cols)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->not_null_cols)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar3 = TableCatalogEntry::GetConstraints(entry);
  puVar2 = (pvVar3->
           super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (pvVar3->
                 super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->(this_00);
    if (pCVar4->type == NOT_NULL) {
      pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_00);
      pNVar5 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar4);
      ::std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->not_null_cols,&(pNVar5->index).index);
    }
  }
  return;
}

Assistant:

explicit TableColumnHelper(TableCatalogEntry &entry) : entry(entry) {
		for (auto &constraint : entry.GetConstraints()) {
			if (constraint->type == ConstraintType::NOT_NULL) {
				auto &not_null = constraint->Cast<NotNullConstraint>();
				not_null_cols.insert(not_null.index.index);
			}
		}
	}